

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O0

double __thiscall llvm::ECError::log(ECError *this,double __x)

{
  raw_ostream *in_RSI;
  double dVar1;
  string local_38;
  raw_ostream *OS_local;
  ECError *this_local;
  
  OS_local = (raw_ostream *)this;
  std::error_code::message_abi_cxx11_(&local_38,&this->EC);
  raw_ostream::operator<<(in_RSI,&local_38);
  dVar1 = (double)std::__cxx11::string::~string((string *)&local_38);
  return dVar1;
}

Assistant:

void log(raw_ostream &OS) const override { OS << EC.message(); }